

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_test.cc
# Opt level: O2

void __thiscall
RandTest_NotObviouslyBroken_Test::~RandTest_NotObviouslyBroken_Test
          (RandTest_NotObviouslyBroken_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RandTest, NotObviouslyBroken) {
  static const uint8_t kZeros[256] = {0};

  uint8_t buf1[256], buf2[256];
  RAND_bytes(buf1, sizeof(buf1));
  RAND_bytes(buf2, sizeof(buf2));

  EXPECT_NE(Bytes(buf1), Bytes(buf2));
  EXPECT_NE(Bytes(buf1), Bytes(kZeros));
  EXPECT_NE(Bytes(buf2), Bytes(kZeros));
}